

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O1

int GetDeepThoughtDataOffset(Data *data)

{
  pointer puVar1;
  ulong uVar2;
  uint uVar3;
  
  puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (int)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish - (int)puVar1;
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      if (((puVar1[uVar2] == 0xff) && ((int)uVar2 + 2 < (int)uVar3)) && (puVar1[uVar2 + 1] == '*'))
      {
        return (int)uVar2 + 2;
      }
      uVar2 = uVar2 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar2);
  }
  return 0;
}

Assistant:

int GetDeepThoughtDataOffset(const Data& data)
{
    for (auto i = 0; i < data.size(); ++i)
    {
        // Check for 255 sync byte
        if (data[i] != 255)
            continue;

        // If 255 is followed by 42 we've found the data start
        if ((i + 2) < data.size() && data[i + 1] == 42)
            return i + 2;
    }

    // Not found
    return 0;
}